

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

void arangodb::velocypack::Collection::forEach(Slice slice,Predicate *predicate)

{
  char cVar1;
  long lVar2;
  ArrayIterator it;
  uint8_t *local_58;
  long local_50;
  ArrayIterator local_48;
  
  ArrayIterator::ArrayIterator(&local_48,slice);
  if (local_48._position != local_48._size) {
    lVar2 = 0;
    do {
      local_58 = (uint8_t *)ArrayIterator::value(&local_48);
      local_50 = lVar2;
      if (*(long *)(predicate + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar1 = (**(code **)(predicate + 0x18))(predicate,&local_58,&local_50);
      if (cVar1 == '\0') {
        return;
      }
      ArrayIterator::next(&local_48);
      lVar2 = lVar2 + 1;
    } while (local_48._position != local_48._size);
  }
  return;
}

Assistant:

void Collection::forEach(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    if (!predicate(it.value(), index)) {
      // abort
      return;
    }
    it.next();
    ++index;
  }
}